

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O2

void __thiscall pg::MSPMSolver::pm_stream(MSPMSolver *this,ostream *out,int *pm)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int i;
  ulong uVar4;
  int iVar5;
  
  iVar1 = pm[1];
  iVar2 = *pm;
  std::operator<<(out," {");
  if (iVar2 == -1) {
    std::operator<<(out," \x1b[1;33mTe\x1b[m");
  }
  else {
    poVar3 = std::operator<<(out," ");
    std::ostream::operator<<(poVar3,*pm);
  }
  if (iVar1 == -1) {
    std::operator<<(out," \x1b[1;33mTo\x1b[m");
  }
  else {
    poVar3 = std::operator<<(out," ");
    std::ostream::operator<<(poVar3,pm[1]);
  }
  uVar4 = 2;
  do {
    if ((long)this->k <= (long)uVar4) {
      std::operator<<(out," } ");
      return;
    }
    poVar3 = std::operator<<(out," ");
    if ((uVar4 & 1) == 0) {
      if (iVar2 != -1) goto LAB_001556b0;
LAB_001556bd:
      iVar5 = 0;
    }
    else {
      if (iVar1 == -1) goto LAB_001556bd;
LAB_001556b0:
      iVar5 = pm[uVar4];
    }
    std::ostream::operator<<(poVar3,iVar5);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void
MSPMSolver::pm_stream(std::ostream &out, int *pm)
{
    bool tope = pm[0] == -1;
    bool topo = pm[1] == -1;
    out << " {";
    if (tope) out << " \033[1;33mTe\033[m";
    else out << " " << pm[0];
    if (topo) out << " \033[1;33mTo\033[m";
    else out << " " << pm[1];
    for (int i=2; i<k; i++) {
        if (i&1) out << " " << (topo ? 0 : pm[i]);
        else     out << " " << (tope ? 0 : pm[i]);
    }
    out << " } ";
}